

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * randomMessageGen_abi_cxx11_(void)

{
  result_type_conflict1 rVar1;
  result_type rVar2;
  string *in_RDI;
  allocator<char> local_2747;
  allocator<char> local_2746;
  allocator<char> local_2745;
  allocator<char> local_2744;
  allocator<char> local_2743;
  allocator<char> local_2742;
  allocator<char> local_2741;
  undefined4 local_2740;
  allocator<char> local_2739;
  uniform_int_distribution<int> local_2738;
  uniform_int_distribution<int> dis;
  int AVALIVABLE_MSG;
  undefined1 local_2720 [8];
  mt19937 gen;
  random_device rd;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  dis._M_param._M_a = 8;
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_2738,1,8);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_2738,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_2720);
  switch(rVar2) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Riddikulus",&local_2739);
    std::allocator<char>::~allocator(&local_2739);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Crucio",&local_2741);
    std::allocator<char>::~allocator(&local_2741);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Lumos",&local_2742);
    std::allocator<char>::~allocator(&local_2742);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Nox",&local_2743);
    std::allocator<char>::~allocator(&local_2743);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Patronus",&local_2744);
    std::allocator<char>::~allocator(&local_2744);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Imperio",&local_2745);
    std::allocator<char>::~allocator(&local_2745);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Expelliarmus",&local_2746);
    std::allocator<char>::~allocator(&local_2746);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Pulvis et umbra sumus",&local_2747);
    std::allocator<char>::~allocator(&local_2747);
  }
  local_2740 = 1;
  std::random_device::~random_device((random_device *)&gen._M_p);
  return in_RDI;
}

Assistant:

string randomMessageGen()
{
    random_device rd;
    mt19937 gen(rd());
    const int AVALIVABLE_MSG = 8;
    uniform_int_distribution<> dis(1, AVALIVABLE_MSG);
    switch (dis(gen)) {
      case 1:
         return "Riddikulus";
      case 2:
          return "Crucio";
      case 3:
          return "Lumos";
      case 4:
          return "Nox";
      case 5:
          return "Patronus";
      case 6:
         return "Imperio";
      case 7:
        return "Expelliarmus";
      default:
         return "Pulvis et umbra sumus";
    }
}